

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O1

int __thiscall NetOptimize::eliminate_reshape_before_binaryop(NetOptimize *this)

{
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar1;
  Layer *pLVar2;
  Layer *pLVar3;
  int *piVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  pvVar1 = (this->super_ModelWriter).layers;
  lVar9 = (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(pvVar1->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar9 != 0) {
    uVar10 = lVar9 >> 3;
    lVar9 = 0;
    do {
      iVar5 = std::__cxx11::string::compare
                        ((char *)&(((this->super_ModelWriter).layers)->
                                  super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)
                                  ._M_impl.super__Vector_impl_data._M_start[lVar9]->type);
      if ((((iVar5 == 0) &&
           (pLVar2 = (((this->super_ModelWriter).layers)->
                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                     super__Vector_impl_data._M_start[lVar9], *(int *)&pLVar2[1]._vptr_Layer == 1))
          && (*(int *)((long)&pLVar2[1]._vptr_Layer + 4) == 1)) &&
         (iVar5._0_1_ = pLVar2[1].support_tensor_storage,
         iVar5._1_1_ = pLVar2[1].support_weight_fp16_storage,
         iVar5._2_1_ = pLVar2[1].support_reserved_0, iVar5._3_1_ = pLVar2[1].support_reserved_1,
         iVar5 == 0)) {
        iVar5 = *(pLVar2->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar7 = lVar9 + 1;
        uVar8 = uVar7;
        while ((uVar7 < uVar10 &&
               (((iVar6 = std::__cxx11::string::compare
                                    ((char *)&(((this->super_ModelWriter).layers)->
                                              super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                              )._M_impl.super__Vector_impl_data._M_start[uVar7]->
                                              type), iVar6 != 0 ||
                 (pLVar3 = (((this->super_ModelWriter).layers)->
                           super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar7],
                 piVar4 = (pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                 (long)*(pointer *)
                        ((long)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl + 8) - (long)piVar4 != 8)) ||
                ((uVar8 = uVar7, *piVar4 != iVar5 && (piVar4[1] != iVar5))))))) {
          uVar7 = uVar7 + 1;
          uVar8 = uVar10;
        }
        if (uVar8 != uVar10) {
          pLVar3 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          fprintf(_stderr,"eliminate_reshape_before_binaryop %s %s\n",
                  (pLVar2->name)._M_dataplus._M_p,(pLVar3->name)._M_dataplus._M_p);
          iVar6 = *(pLVar2->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = ((((this->super_ModelWriter).layers)->
                    super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[uVar8]->bottoms).
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          if (*piVar4 == iVar5) {
            *(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = iVar6;
          }
          if (piVar4[1] == iVar5) {
            *(int *)(*(long *)&(pLVar3->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data + 4) = iVar6;
          }
          (((this->super_ModelWriter).blobs)->
          super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
          super__Vector_impl_data._M_start[iVar6].consumer = (int)uVar8;
          std::__cxx11::string::_M_replace
                    ((ulong)&pLVar2->type,0,(char *)(pLVar2->type)._M_string_length,0x32319a);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != uVar10 + (uVar10 == 0));
  }
  return 0;
}

Assistant:

int NetOptimize::eliminate_reshape_before_binaryop()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Reshape")
            continue;

        ncnn::Reshape* reshape = (ncnn::Reshape*)layers[i];
        if (reshape->w != 1 || reshape->h != 1 || reshape->permute != 0)
            continue;

        // Reshape - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index || layers[j]->bottoms[1] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        fprintf(stderr, "eliminate_reshape_before_binaryop %s %s\n", reshape->name.c_str(), binaryop->name.c_str());

        int bottom_blob_index_final = reshape->bottoms[0];
        if (layers[j]->bottoms[0] == top_blob_index)
            binaryop->bottoms[0] = bottom_blob_index_final;
        if (layers[j]->bottoms[1] == top_blob_index)
            binaryop->bottoms[1] = bottom_blob_index_final;
        blobs[bottom_blob_index_final].consumer = j;
        reshape->type = "ncnnfused";
    }

    return 0;
}